

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall
ON_PolyCurve::Evaluate
          (ON_PolyCurve *this,double t,int der_count,int v_stride,double *v,int side,int *hint)

{
  double dVar1;
  double dVar2;
  ON_Curve *pOVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  double *pdVar7;
  ON_Curve **ppOVar8;
  double dVar9;
  double in_XMM1_Qa;
  int local_ec;
  double local_e8;
  uint local_cc;
  int local_c0;
  int local_bc;
  int vi;
  int di;
  double d_1;
  double b;
  double a_1;
  double d;
  double s;
  double t1;
  double t0;
  ON_Interval dom;
  double s1;
  double s0;
  ON_Curve *c;
  double a;
  int segment_index;
  int curve_hint;
  int segment_hint;
  int dim;
  int count;
  bool rc;
  int *hint_local;
  double *pdStack_28;
  int side_local;
  double *v_local;
  int v_stride_local;
  int der_count_local;
  double t_local;
  ON_PolyCurve *this_local;
  
  dim._3_1_ = 0;
  _count = (uint *)hint;
  hint_local._4_4_ = side;
  pdStack_28 = v;
  v_local._0_4_ = v_stride;
  v_local._4_4_ = der_count;
  _v_stride_local = (ON_Curve *)t;
  t_local = (double)this;
  segment_hint = Count(this);
  curve_hint = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
  if (((0 < segment_hint) && (0 < curve_hint)) && (curve_hint <= (int)(uint)v_local)) {
    if (_count == (uint *)0x0) {
      local_cc = 0;
    }
    else {
      local_cc = *_count & 0x3fff;
    }
    segment_index = local_cc;
    iVar5 = segment_hint + 1;
    pdVar7 = ::ON_SimpleArray::operator_cast_to_double_((ON_SimpleArray *)&this->m_t);
    a._0_4_ = ON_NurbsSpanIndex(2,iVar5,pdVar7,(double)_v_stride_local,hint_local._4_4_,
                                segment_index);
    uVar6 = hint_local._4_4_;
    if ((hint_local._4_4_ == 0xfffffffe) || (hint_local._4_4_ == 2)) {
      c = _v_stride_local;
      pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,a._0_4_);
      dVar9 = *pdVar7;
      pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,a._0_4_ + 1);
      in_XMM1_Qa = *pdVar7;
      bVar4 = ON_TuneupEvaluationParameter(uVar6,dVar9,in_XMM1_Qa,(double *)&c);
      if (bVar4) {
        _v_stride_local = c;
        iVar5 = segment_hint + 1;
        pdVar7 = ::ON_SimpleArray::operator_cast_to_double_((ON_SimpleArray *)&this->m_t);
        a._0_4_ = ON_NurbsSpanIndex(2,iVar5,pdVar7,(double)_v_stride_local,hint_local._4_4_,a._0_4_)
        ;
      }
    }
    ppOVar8 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,a._0_4_);
    pOVar3 = *ppOVar8;
    if (pOVar3 != (ON_Curve *)0x0) {
      (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
      dom.m_t[0] = in_XMM1_Qa;
      dVar9 = ON_Interval::Min((ON_Interval *)&t0);
      dom.m_t[1] = ON_Interval::Max((ON_Interval *)&t0);
      if ((dVar9 != dom.m_t[1]) || (NAN(dVar9) || NAN(dom.m_t[1]))) {
        pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,a._0_4_);
        dVar1 = *pdVar7;
        pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,a._0_4_ + 1);
        dVar2 = *pdVar7;
        if ((dVar9 != dVar1) ||
           (((NAN(dVar9) || NAN(dVar1) || (dom.m_t[1] != dVar2)) || (NAN(dom.m_t[1]) || NAN(dVar2)))
           )) {
          if (ABS(dVar1) * 2.220446049250313e-16 + 2.3283064365386963e-10 <= ABS(dVar2 - dVar1)) {
            b = ((double)_v_stride_local - dVar1) / (dVar2 - dVar1);
            d_1 = (dVar2 - (double)_v_stride_local) / (dVar2 - dVar1);
            if ((d_1 != 0.0) || (NAN(d_1))) {
              if ((d_1 != 1.0) || (NAN(d_1))) {
                if ((b != 0.0) || (NAN(b))) {
                  if ((b == 1.0) && (!NAN(b))) {
                    d_1 = 0.0;
                  }
                }
                else {
                  d_1 = 1.0;
                }
              }
              else {
                b = 0.0;
              }
            }
            else {
              b = 1.0;
            }
            d = d_1 * dVar9 + b * dom.m_t[1];
          }
          else {
            local_e8 = dVar9;
            if (ABS((double)_v_stride_local - dVar2) <= ABS((double)_v_stride_local - dVar1)) {
              local_e8 = dom.m_t[1];
            }
            d = local_e8;
          }
          if (hint_local._4_4_ == 0xffffffff) {
            hint_local._4_4_ = 0xfffffffe;
          }
          else if (hint_local._4_4_ == 1) {
            hint_local._4_4_ = 2;
          }
        }
        else {
          d = (double)_v_stride_local;
        }
        if ((_count == (uint *)0x0) || (segment_index != a._0_4_)) {
          local_ec = 0;
        }
        else {
          local_ec = (int)*_count >> 0xe;
        }
        a._4_4_ = local_ec;
        uVar6 = (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3b])
                          (d,pOVar3,(ulong)v_local._4_4_,(ulong)(uint)v_local,pdStack_28,
                           (ulong)hint_local._4_4_,(long)&a + 4);
        dim._3_1_ = (byte)uVar6 & 1;
        if ((uVar6 & 1) != 0) {
          if (((0 < (int)v_local._4_4_) &&
              ((dom.m_t[1] - dVar9 != dVar2 - dVar1 ||
               (NAN(dom.m_t[1] - dVar9) || NAN(dVar2 - dVar1))))) &&
             ((dVar1 != dVar2 || (NAN(dVar1) || NAN(dVar2))))) {
            dVar9 = (dom.m_t[1] - dVar9) / (dVar2 - dVar1);
            pdStack_28 = pdStack_28 + (int)(uint)v_local;
            d = dVar9;
            for (local_bc = 1; local_bc <= (int)v_local._4_4_; local_bc = local_bc + 1) {
              for (local_c0 = 0; local_c0 < curve_hint; local_c0 = local_c0 + 1) {
                pdStack_28[local_c0] = d * pdStack_28[local_c0];
              }
              d = dVar9 * d;
              pdStack_28 = pdStack_28 + (int)(uint)v_local;
            }
          }
          if (_count != (uint *)0x0) {
            *_count = a._0_4_ | a._4_4_ << 0xe;
          }
        }
      }
    }
  }
  return (bool)(dim._3_1_ & 1);
}

Assistant:

bool ON_PolyCurve::Evaluate( // returns false if unable to evaluate
       double t,       // evaluation parameter
       int der_count,  // number of derivatives (>=0)
       int v_stride,   // v[] array stride (>=Dimension())
       double* v,      // v[] array of length stride*(ndir+1)
       int side,       // optional - determines which side to evaluate from
                       //         0 = default
                       //      <  0 to evaluate from below, 
                       //      >  0 to evaluate from above
       int* hint       // optional - evaluation hint (int) used to speed
                       //            repeated evaluations
       ) const
{
  bool rc = false;
  const int count = Count();
  const int dim = Dimension();
  int segment_hint, curve_hint;
  if ( count > 0 && dim > 0 && dim <= v_stride ) 
  {
    segment_hint = (hint) ? (*hint & 0x3FFF) : 0;
    int segment_index = ON_NurbsSpanIndex(2,count+1,m_t,t,side,segment_hint);
    if ( -2 == side || 2 == side )
    {
      // 9 November 2010 Dale Lear - ON_TuneupEvaluationParameter fix
      //   When evaluation passes through ON_CurveProxy or ON_PolyCurve reparamterization
      //   and the original side parameter was -1 or +1, it is changed to -2 or +2
      //   to indicate that if t is numerically closed to an end parameter, then
      //   it should be tuned up to be at the end parameter.
      double a = t;
      if ( ON_TuneupEvaluationParameter( side, m_t[segment_index], m_t[segment_index+1], &a) )
      {
        // recalculate segment index
        t = a;
        segment_index = ON_NurbsSpanIndex(2,count+1,m_t,t,side,segment_index);
      }
    }
    const ON_Curve* c = m_segment[segment_index];
    if ( c ) {
      double s0, s1;
      {
        ON_Interval dom = c->Domain();
        s0 = dom.Min();
        s1 = dom.Max();
      }
      if ( s0 != s1 ) 
      {
        const double t0 = m_t[segment_index];
        const double t1 = m_t[segment_index+1];
        double s;
        if ( s0 == t0 && s1 == t1 )
        {
          // segment domain = c->Domain()
          s = t;
        }
        else 
        {
          // adjust segment domain parameter
          if ( fabs(t1 - t0) < (ON_ZERO_TOLERANCE + ON_EPSILON*fabs(t0)) )
          {
            // segment domain is insanely short
            s = (fabs(t-t0) < fabs(t-t1)) ? s0 : s1;
          }
          else 
          {
            // 30 May 2012 Dale Lear bug # 105974
            //   The arithmetic below was setting b = 0 and a = 0.9999999999999...
            //   so I added the checking for 0 and 1 stuff.
            const double d = t1-t0;
            double a = (t - t0)/d;
            double b = (t1 - t)/d;
            if ( 0.0 == b )
              a = 1.0;
            else if ( 1.0 == b )
              a = 0.0;
            else if ( 0.0 == a )
              b = 1.0;
            else if ( 1.0 == a )
              b = 0.0;
            s = b*s0 + a*s1;
          }
          if ( -1 == side )
            side = -2;
          else if ( 1 == side )
            side = 2;
        }
        curve_hint = ( hint && segment_hint == segment_index ) ? ((*hint)>>14) : 0;
        rc = c->Evaluate(
           s, 
           der_count, 
           v_stride, v, 
           side, 
           &curve_hint );

        if ( rc ) 
        {
          if ( der_count > 0 && s1 - s0 != t1 - t0 && t0 != t1 )
          {
            // Adjust segment derivative evaluation bug by applying chain rule
            // to get polycurve derivative value.
            const double d = (s1-s0)/(t1-t0);
            s = d;
            int di, vi;
            v += v_stride;
            for ( di = 1; di <= der_count; di++ )
            {
              for ( vi = 0; vi < dim; vi++ ) 
              {
                v[vi] = s*v[vi];
              }
              s *= d;
              v += v_stride;
            }
          }

          if ( hint )
            *hint = segment_index | (curve_hint<<14);
        }

      }
    }
  }
  return rc;
}